

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O2

void csguide_webserver::Epoll::HandleConnection(ServerSocket *server_socket)

{
  int fd;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  ClientSocket *pCVar4;
  HttpData *__p;
  HttpRequest *this;
  HttpResponse *this_00;
  ostream *poVar5;
  __uint32_t events;
  allocator local_b9;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2> local_a8;
  shared_ptr<csguide_webserver::HttpData> sharedHttpData;
  __shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  pCVar4 = (ClientSocket *)operator_new(0x18);
  pCVar4->fd_ = -1;
  std::__shared_ptr<csguide_webserver::ClientSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<csguide_webserver::ClientSocket,void>
            ((__shared_ptr<csguide_webserver::ClientSocket,(__gnu_cxx::_Lock_policy)2> *)&local_b8,
             pCVar4);
  while( true ) {
    iVar3 = ServerSocket::Accept(server_socket,(ClientSocket *)local_b8);
    if (iVar3 < 1) break;
    iVar3 = SetNonBlocking(*(int *)((long)&(local_b8->status_msg_)._M_string_length + 4));
    if (iVar3 < 0) {
      iVar3 = 0x10e998;
      poVar5 = std::operator<<((ostream *)&std::cout,"setnonblocking error");
      std::endl<char,std::char_traits<char>>(poVar5);
      ClientSocket::close((ClientSocket *)local_b8,iVar3);
    }
    else {
      __p = (HttpData *)operator_new(0x58);
      (__p->client_socket_).
      super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->client_socket_).
      super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
      super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
      super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __p->epoll_fd = -1;
      (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::HttpData,void>
                ((__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2> *)
                 &sharedHttpData.
                  super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>,__p);
      this = (HttpRequest *)operator_new(0x68);
      std::__cxx11::string::string((string *)&local_50,"",&local_b9);
      HttpRequest::HttpRequest(this,&local_50,METHOD_NOT_SUPPORT,VERSION_NOT_SUPPORT);
      std::__shared_ptr<csguide_webserver::HttpRequest,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::HttpRequest,void>
                ((__shared_ptr<csguide_webserver::HttpRequest,(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8,this);
      std::__shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((sharedHttpData.
                    super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->request_).
                  super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = (HttpResponse *)operator_new(0xb8);
      HttpResponse::HttpResponse(this_00,true);
      std::__shared_ptr<csguide_webserver::HttpResponse,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::HttpResponse,void>
                ((__shared_ptr<csguide_webserver::HttpResponse,(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8,this_00);
      std::__shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((sharedHttpData.
                    super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->response_).
                  super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>,
                 &local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      pCVar4 = (ClientSocket *)operator_new(0x18);
      pCVar4->fd_ = -1;
      std::__shared_ptr<csguide_webserver::ClientSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::ClientSocket,void>
                ((__shared_ptr<csguide_webserver::ClientSocket,(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8,pCVar4);
      _Var2._M_pi = _Stack_b0._M_pi;
      peVar1 = local_b8;
      local_b8 = local_a8._M_ptr;
      _Stack_b0._M_pi = local_a8._M_refcount._M_pi;
      local_a8._M_ptr = peVar1;
      local_a8._M_refcount._M_pi = _Var2._M_pi;
      std::__shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((sharedHttpData.
                    super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->client_socket_).
                  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_a8);
      iVar3 = server_socket->epoll_fd_;
      (sharedHttpData.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->epoll_fd = iVar3;
      fd = *(int *)((long)&((local_a8._M_ptr)->status_msg_)._M_string_length + 4);
      std::__shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 &sharedHttpData.
                  super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>);
      Addfd(iVar3,fd,events,(shared_ptr<csguide_webserver::HttpData> *)&local_70);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &sharedHttpData.
                  super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>);
      TimerManager::addTimer
                ((TimerManager *)timer_manager_,(shared_ptr<csguide_webserver::HttpData> *)&local_60
                 ,20000);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sharedHttpData.
                  super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  return;
}

Assistant:

void Epoll::HandleConnection(const ServerSocket &server_socket) {
  std::shared_ptr<ClientSocket> tempClient(new ClientSocket);
  // epoll 是ET模式，循环接收连接
  // 需要将listen_fd设置为non-blocking

  while (server_socket.Accept(*tempClient) > 0) {
    // 设置非阻塞
    int ret = SetNonBlocking(tempClient->fd_);
    if (ret < 0) {
      std::cout << "setnonblocking error" << std::endl;
      tempClient->close();
      continue;
    }

    // FIXME 接受新客户端 构造HttpData并添加定时器

    // 在这里做限制并发, 暂时未完成

    std::shared_ptr<HttpData> sharedHttpData(new HttpData);
    sharedHttpData->request_ = std::shared_ptr<HttpRequest>(new HttpRequest());
    sharedHttpData->response_ = std::shared_ptr<HttpResponse>(new HttpResponse());

    std::shared_ptr<ClientSocket> sharedClientSocket(new ClientSocket());
    sharedClientSocket.swap(tempClient);
    sharedHttpData->client_socket_ = sharedClientSocket;
    sharedHttpData->epoll_fd = server_socket.epoll_fd_;
    Addfd(server_socket.epoll_fd_, sharedClientSocket->fd_, DEFAULT_EVENTS, sharedHttpData);
    // FIXME 默认超时时间5 秒测试添加定时器
    timer_manager_.addTimer(sharedHttpData, TimerManager::DEFAULT_TIME_OUT);
  }
}